

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_post_demo.c
# Opt level: O0

int callback_post_demo(lws *wsi,lws_callback_reasons reason,void *user,void *in,size_t len)

{
  int iVar1;
  int iVar2;
  lws_spa *plVar3;
  uchar *buf;
  uchar *end_00;
  int n;
  uchar *end;
  uchar *start;
  uchar *p;
  per_session_data__post_demo *pss;
  size_t len_local;
  void *in_local;
  void *user_local;
  lws *plStack_18;
  lws_callback_reasons reason_local;
  lws *wsi_local;
  
  p = (uchar *)user;
  pss = (per_session_data__post_demo *)len;
  len_local = (size_t)in;
  in_local = user;
  user_local._4_4_ = reason;
  plStack_18 = wsi;
  switch(reason) {
  case LWS_CALLBACK_HTTP_BODY:
    if (*user == 0) {
      plVar3 = lws_spa_create(wsi,param_names,4,0x400,file_upload_cb,user);
      *(lws_spa **)p = plVar3;
      if (*(long *)p == 0) {
        return -1;
      }
      p[0x818] = '\0';
      p[0x858] = '\0';
      p[0x859] = '\0';
      p[0x85a] = '\0';
      p[0x85b] = '\0';
      p[0x85c] = '\0';
      p[0x85d] = '\0';
      p[0x85e] = '\0';
      p[0x85f] = '\0';
    }
    iVar1 = lws_spa_process(*(lws_spa **)p,(char *)len_local,(int)pss);
    if (iVar1 != 0) {
      return -1;
    }
    break;
  case LWS_CALLBACK_HTTP_BODY_COMPLETION:
    _lws_log(0x10,"LWS_CALLBACK_HTTP_BODY_COMPLETION: %p\n",wsi);
    lws_spa_finalize(*(lws_spa **)p);
    p[0x864] = p[0x864] & 0xfe | 1;
    lws_callback_on_writable(plStack_18);
    break;
  default:
    break;
  case LWS_CALLBACK_HTTP_WRITEABLE:
    if ((*(byte *)((long)user + 0x864) & 1) != 0) {
      buf = (uchar *)((long)user + 0x18);
      end_00 = (uchar *)((long)user + 0x817);
      start = buf;
      if ((*(byte *)((long)user + 0x864) >> 1 & 1) == 0) {
        iVar1 = format_result((per_session_data__post_demo *)user);
        iVar2 = lws_add_http_header_status(plStack_18,200,&start,end_00);
        if ((((iVar2 != 0) ||
             (iVar2 = lws_add_http_header_by_token
                                (plStack_18,WSI_TOKEN_HTTP_CONTENT_TYPE,(uchar *)"text/html",9,
                                 &start,end_00), iVar2 != 0)) ||
            (iVar1 = lws_add_http_header_content_length(plStack_18,(long)iVar1,&start,end_00),
            iVar1 != 0)) ||
           ((iVar1 = lws_finalize_http_header(plStack_18,&start,end_00), iVar1 != 0 ||
            (iVar1 = lws_write(plStack_18,buf,(long)((int)start - (int)buf),LWS_WRITE_HTTP_HEADERS),
            iVar1 < 0)))) {
          return 1;
        }
        p[0x864] = p[0x864] & 0xfd | 2;
        lws_callback_on_writable(plStack_18);
      }
      else if ((*(byte *)((long)user + 0x864) >> 2 & 1) == 0) {
        iVar1 = format_result((per_session_data__post_demo *)user);
        iVar1 = lws_write(plStack_18,buf,(long)iVar1,LWS_WRITE_HTTP_FINAL);
        p[0x864] = p[0x864] & 0xfb | 4;
        if (iVar1 < 0) {
          return 1;
        }
        iVar1 = lws_http_transaction_completed(plStack_18);
        if (iVar1 != 0) {
          return -1;
        }
        return 0;
      }
    }
    break;
  case LWS_CALLBACK_HTTP_DROP_PROTOCOL:
    if (*user != 0) {
      lws_spa_destroy(*user);
      p[0] = '\0';
      p[1] = '\0';
      p[2] = '\0';
      p[3] = '\0';
      p[4] = '\0';
      p[5] = '\0';
      p[6] = '\0';
      p[7] = '\0';
    }
  }
  return 0;
}

Assistant:

static int
callback_post_demo(struct lws *wsi, enum lws_callback_reasons reason,
		   void *user, void *in, size_t len)
{
	struct per_session_data__post_demo *pss =
			(struct per_session_data__post_demo *)user;
	unsigned char *p, *start, *end;
	int n;

	switch (reason) {
	case LWS_CALLBACK_HTTP_BODY:
		/* create the POST argument parser if not already existing */
		if (!pss->spa) {
			pss->spa = lws_spa_create(wsi, param_names,
					LWS_ARRAY_SIZE(param_names), 1024,
					file_upload_cb, pss);
			if (!pss->spa)
				return -1;

			pss->filename[0] = '\0';
			pss->file_length = 0;
		}

		/* let it parse the POST data */
		if (lws_spa_process(pss->spa, in, (int)len))
			return -1;
		break;

	case LWS_CALLBACK_HTTP_BODY_COMPLETION:
		lwsl_debug("LWS_CALLBACK_HTTP_BODY_COMPLETION: %p\n", wsi);
		/* call to inform no more payload data coming */
		lws_spa_finalize(pss->spa);

		pss->completed = 1;
		lws_callback_on_writable(wsi);
		break;

	case LWS_CALLBACK_HTTP_WRITEABLE:
		if (!pss->completed)
			break;

		p = (unsigned char *)pss->result + LWS_PRE;
		start = p;
		end = p + sizeof(pss->result) - LWS_PRE - 1;

		if (!pss->sent_headers) {
			n = format_result(pss);

			if (lws_add_http_header_status(wsi, HTTP_STATUS_OK,
						       &p, end))
				goto bail;

			if (lws_add_http_header_by_token(wsi,
					WSI_TOKEN_HTTP_CONTENT_TYPE,
					(unsigned char *)"text/html", 9,
					&p, end))
				goto bail;
			if (lws_add_http_header_content_length(wsi, n, &p, end))
				goto bail;
			if (lws_finalize_http_header(wsi, &p, end))
				goto bail;

			/* first send the headers ... */
			n = lws_write(wsi, start, lws_ptr_diff(p, start),
				      LWS_WRITE_HTTP_HEADERS);
			if (n < 0)
				goto bail;

			pss->sent_headers = 1;
			lws_callback_on_writable(wsi);
			break;
		}

		if (!pss->sent_body) {
			n = format_result(pss);

			n = lws_write(wsi, (unsigned char *)start, n,
				      LWS_WRITE_HTTP_FINAL);

			pss->sent_body = 1;
			if (n < 0)
				return 1;
			goto try_to_reuse;
		}
		break;

	case LWS_CALLBACK_HTTP_DROP_PROTOCOL:
		/* called when our wsi user_space is going to be destroyed */
		if (pss->spa) {
			lws_spa_destroy(pss->spa);
			pss->spa = NULL;
		}
		break;

	default:
		break;
	}

	return 0;

bail:

	return 1;

try_to_reuse:
	if (lws_http_transaction_completed(wsi))
		return -1;

	return 0;
}